

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void Catch::anon_unknown_26::enforceNoDuplicateTestCases
               (vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests)

{
  bool bVar1;
  reference this;
  string *msg;
  ReusableStringStream *pRVar2;
  undefined8 in_RDI;
  pair<std::_Rb_tree_const_iterator<const_Catch::TestCaseInfo_*>,_bool> pVar3;
  pair<std::_Rb_tree_const_iterator<const_Catch::TestCaseInfo_*>,_bool> prev;
  TestCaseInfo *infoPtr;
  TestCaseHandle *test;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *__range2;
  set<const_Catch::TestCaseInfo_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:6514:32)_&,_std::allocator<const_Catch::TestCaseInfo_*>_>
  seenTests;
  anon_class_1_0_00000001 testInfoCmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  ReusableStringStream *in_stack_fffffffffffffeb0;
  value_type *in_stack_fffffffffffffec8;
  allocator_type *in_stack_fffffffffffffed0;
  anon_class_1_0_00000001 *in_stack_fffffffffffffed8;
  set<const_Catch::TestCaseInfo_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:6514:32)_&,_std::allocator<const_Catch::TestCaseInfo_*>_>
  *in_stack_fffffffffffffee0;
  TestCaseInfo *in_stack_ffffffffffffff38;
  __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
  local_68;
  undefined8 local_60;
  undefined8 local_8;
  
  local_8 = in_RDI;
  std::allocator<const_Catch::TestCaseInfo_*>::allocator
            ((allocator<const_Catch::TestCaseInfo_*> *)0x193fa1);
  std::
  set<const_Catch::TestCaseInfo_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:6514:32)_&,_std::allocator<const_Catch::TestCaseInfo_*>_>
  ::set(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::allocator<const_Catch::TestCaseInfo_*>::~allocator
            ((allocator<const_Catch::TestCaseInfo_*> *)0x193fca);
  local_60 = local_8;
  local_68._M_current =
       (TestCaseHandle *)
       std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::begin
                 ((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
                  in_stack_fffffffffffffea8);
  std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::end
            ((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
             in_stack_fffffffffffffea8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                        *)in_stack_fffffffffffffeb0,
                       (__normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                        *)in_stack_fffffffffffffea8);
    if (!bVar1) {
      std::
      set<const_Catch::TestCaseInfo_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:6514:32)_&,_std::allocator<const_Catch::TestCaseInfo_*>_>
      ::~set((set<const_Catch::TestCaseInfo_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:6514:32)_&,_std::allocator<const_Catch::TestCaseInfo_*>_>
              *)0x1942c2);
      return;
    }
    this = __gnu_cxx::
           __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
           ::operator*(&local_68);
    TestCaseHandle::getTestCaseInfo(this);
    pVar3 = std::
            set<const_Catch::TestCaseInfo_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:6514:32)_&,_std::allocator<const_Catch::TestCaseInfo_*>_>
            ::insert((set<const_Catch::TestCaseInfo_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:6514:32)_&,_std::allocator<const_Catch::TestCaseInfo_*>_>
                      *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
    ::operator++(&local_68);
  }
  ReusableStringStream::ReusableStringStream(in_stack_fffffffffffffeb0);
  ReusableStringStream::operator<<
            (in_stack_fffffffffffffeb0,(char (*) [19])in_stack_fffffffffffffea8);
  ReusableStringStream::operator<<(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  ReusableStringStream::operator<<
            (in_stack_fffffffffffffeb0,(char (*) [15])in_stack_fffffffffffffea8);
  TestCaseInfo::tagsAsString_abi_cxx11_(in_stack_ffffffffffffff38);
  ReusableStringStream::operator<<(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  msg = (string *)
        ReusableStringStream::operator<<
                  (in_stack_fffffffffffffeb0,(char (*) [20])in_stack_fffffffffffffea8);
  ReusableStringStream::operator<<
            (in_stack_fffffffffffffeb0,(char (*) [16])in_stack_fffffffffffffea8);
  std::_Rb_tree_const_iterator<const_Catch::TestCaseInfo_*>::operator*
            ((_Rb_tree_const_iterator<const_Catch::TestCaseInfo_*> *)0x194172);
  ReusableStringStream::operator<<
            (in_stack_fffffffffffffeb0,(SourceLineInfo *)in_stack_fffffffffffffea8);
  ReusableStringStream::operator<<
            (in_stack_fffffffffffffeb0,(char (*) [2])in_stack_fffffffffffffea8);
  pRVar2 = ReusableStringStream::operator<<
                     (in_stack_fffffffffffffeb0,(char (*) [15])in_stack_fffffffffffffea8);
  pRVar2 = ReusableStringStream::operator<<(pRVar2,(SourceLineInfo *)in_stack_fffffffffffffea8);
  ReusableStringStream::str_abi_cxx11_(pRVar2);
  throw_domain_error(msg);
}

Assistant:

static void enforceNoDuplicateTestCases(
            std::vector<TestCaseHandle> const& tests ) {
            auto testInfoCmp = []( TestCaseInfo const* lhs,
                                   TestCaseInfo const* rhs ) {
                return *lhs < *rhs;
            };
            std::set<TestCaseInfo const*, decltype( testInfoCmp )&> seenTests(
                testInfoCmp );
            for ( auto const& test : tests ) {
                const auto infoPtr = &test.getTestCaseInfo();
                const auto prev = seenTests.insert( infoPtr );
                CATCH_ENFORCE( prev.second,
                               "error: test case \""
                                   << infoPtr->name << "\", with tags \""
                                   << infoPtr->tagsAsString()
                                   << "\" already defined.\n"
                                   << "\tFirst seen at "
                                   << ( *prev.first )->lineInfo << "\n"
                                   << "\tRedefined at " << infoPtr->lineInfo );
            }
        }